

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O1

int Dau_DecPerform6(word *p,int nVars,uint uSet)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  word wVar12;
  word wVar13;
  uint uVar14;
  int iVar15;
  int nVarsD;
  int nVarsC;
  int nVarsS;
  word tComp;
  uint local_8d0;
  int local_8cc;
  word tDec;
  ulong local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  ulong local_8a8;
  word *local_8a0;
  ulong local_898;
  word tDec0;
  int pPermD [16];
  int pPermC [16];
  char pDsdD [1000];
  char pDsdC [1000];
  
  iVar15 = 0;
  tComp = 0;
  tDec = 0;
  local_8cc = nVars;
  local_8a0 = p;
  iVar1 = Dau_DecDecomposeSet(p,nVars,uSet,&tComp,&tDec0,pPermC,pPermD,&nVarsC,&nVarsD,&nVarsS);
  if (iVar1 == 0) {
    puts("  Decomposition does not exist");
  }
  else {
    uVar14 = nVarsC - 1;
    if (5 < uVar14) {
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x337,"word Abc_Tt6Cofactor0(word, int)");
    }
    if (5 < uVar14) {
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x33c,"word Abc_Tt6Cofactor1(word, int)");
    }
    lVar5 = (long)nVarsD;
    lVar2 = (long)nVarsS;
    uVar10 = nVarsC + ~nVarsS;
    local_8a8 = (ulong)uVar10;
    local_8b0 = (s_Truths6Neg[uVar14] & tComp) << ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) |
                s_Truths6Neg[uVar14] & tComp;
    uVar6 = 1 << ((byte)(1 << ((byte)nVarsS & 0x1f)) & 0x1f);
    local_8b8 = (tComp & s_Truths6[uVar14]) >> ((byte)(1 << ((byte)uVar14 & 0x1f)) & 0x3f) |
                tComp & s_Truths6[uVar14];
    local_8c0 = tDec0;
    if ((int)uVar6 < 2) {
      uVar6 = 1;
    }
    local_898 = 0;
    uVar14 = 0;
    local_8d0 = uVar6;
    do {
      if ((uVar14 & 1) == 0) {
        if ((ulong)(uint)nVarsS == 0x1f) {
          uVar8 = 0;
          uVar4 = 0;
        }
        else {
          uVar6 = 1 << ((byte)nVarsS & 0x1f);
          if ((int)uVar6 < 2) {
            uVar6 = 1;
          }
          uVar4 = 0;
          uVar8 = 0;
          uVar7 = 0;
          do {
            if ((uVar14 >> (uVar7 & 0x1f) & 1) != 0) {
              if (nVarsS < 1) {
                uVar11 = 0xffffffffffffffff;
                uVar9 = 0xffffffffffffffff;
              }
              else {
                uVar9 = 0xffffffffffffffff;
                uVar3 = 0;
                uVar11 = 0xffffffffffffffff;
                do {
                  if ((uVar7 >> ((uint)uVar3 & 0x1f) & 1) == 0) {
                    wVar12 = ~s_Truths6[uVar3 + (long)(int)uVar10];
                  }
                  else {
                    wVar12 = s_Truths6[uVar3 + (long)(int)uVar10];
                  }
                  if ((1 << ((byte)uVar3 & 0x1f) & uVar7) == 0) {
                    wVar13 = ~s_Truths6[uVar3 + (lVar5 - lVar2)];
                  }
                  else {
                    wVar13 = s_Truths6[uVar3 + (lVar5 - lVar2)];
                  }
                  uVar9 = uVar9 & wVar13;
                  uVar11 = uVar11 & wVar12;
                  uVar3 = uVar3 + 1;
                } while ((uint)nVarsS != uVar3);
              }
              uVar4 = uVar4 | uVar11;
              uVar8 = uVar8 | uVar9;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar6);
        }
        tDec = uVar8 ^ local_8c0;
        uVar8 = uVar4 & local_8b8 | local_8b0 & ~uVar4;
        tComp = ((uVar4 & local_8b0 | ~uVar4 & local_8b8) ^ uVar8) &
                s_Truths6[nVarsS + (int)local_8a8] ^ uVar8;
        Dau_DsdDecompose(&tComp,nVarsC,0,1,pDsdC);
        Dau_DsdDecompose(&tDec,nVarsD,0,1,pDsdD);
        Dau_DecVarReplace(pDsdD,pPermD,nVarsD);
        Dau_DecVarReplace(pDsdC,pPermC,nVarsC);
        iVar1 = (int)local_898;
        printf("%3d : ");
        printf("%24s  ",pDsdD);
        printf("%24s  ",pDsdC);
        Dau_DecVerify(local_8a0,local_8cc,pDsdC,pDsdD);
        local_898 = (ulong)(iVar1 + 1);
        uVar6 = local_8d0;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar6);
    iVar15 = 1;
  }
  return iVar15;
}

Assistant:

int Dau_DecPerform6( word * p, int nVars, unsigned uSet )
{
    word tComp = 0, tDec = 0, tDec0, tComp0, tComp1, FuncC, FuncD;
    char pDsdC[1000], pDsdD[1000];
    int pPermC[16], pPermD[16];
    int nVarsC, nVarsD, nVarsS, nVarsU, nVarsF, nPairs;
    int i, m, v, status, ResC, ResD, Counter = 0;
    status = Dau_DecDecomposeSet( p, nVars, uSet, &tComp, &tDec0, pPermC, pPermD, &nVarsC, &nVarsD, &nVarsS );
    if ( !status )
    {
        printf( "  Decomposition does not exist\n" );
        return 0;
    }
    nVarsU = nVarsD - nVarsS;
    nVarsF = nVarsC - nVarsS - 1;
    tComp0 = Abc_Tt6Cofactor0( tComp, nVarsF + nVarsS );
    tComp1 = Abc_Tt6Cofactor1( tComp, nVarsF + nVarsS );
    nPairs = 1 << (1 << nVarsS); 
    for ( i = 0; i < nPairs; i++ )
    {
        if ( i & 1 )
            continue;
        // create miterms with this polarity
        FuncC = FuncD = 0;
        for ( m = 0; m < (1 << nVarsS); m++ )
        {
            word MintC, MintD;
            if ( !((i >> m) & 1) )
                continue;
            MintC = MintD = ~(word)0;
            for ( v = 0; v < nVarsS; v++ )
            {
                MintC &= ((m >> v) & 1) ? s_Truths6[nVarsF+v] : ~s_Truths6[nVarsF+v];
                MintD &= ((m >> v) & 1) ? s_Truths6[nVarsU+v] : ~s_Truths6[nVarsU+v];
            }
            FuncC |= MintC;
            FuncD |= MintD;
        }
        // uncomplement given variables
        tComp = (~s_Truths6[nVarsF + nVarsS] & ((tComp0 & ~FuncC) | (tComp1 & FuncC))) | (s_Truths6[nVarsF + nVarsS] & ((tComp1 & ~FuncC) | (tComp0 & FuncC)));
        tDec = tDec0 ^ FuncD;
        // decompose
        ResC = Dau_DsdDecompose( &tComp, nVarsC, 0, 1, pDsdC );
        ResD = Dau_DsdDecompose( &tDec, nVarsD, 0, 1, pDsdD );
        // replace variables
        Dau_DecVarReplace( pDsdD, pPermD, nVarsD );
        Dau_DecVarReplace( pDsdC, pPermC, nVarsC );
        // report
//        printf( "  " );
        printf( "%3d : ", Counter++ );
        printf( "%24s  ", pDsdD );
        printf( "%24s  ", pDsdC );
        Dau_DecVerify( p, nVars, pDsdC, pDsdD );
    }
    return 1;
}